

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalForcesContIntDamping
          (ChElementShellANCF_3443 *this,ChVectorDynamic<> *Fi)

{
  double dVar1;
  ChKblockGeneric *pCVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long lVar41;
  pointer pLVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  void *pvVar48;
  undefined8 *puVar49;
  long lVar50;
  double *pdVar51;
  char *__function;
  double dVar52;
  ulong uVar53;
  ChElementShellANCF_3443 *pCVar54;
  ChElementShellANCF_3443 *this_00;
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  ChMatrixNM<double,_6,_6> D;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  MatrixNx3 QiCompact;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx6 ebar_ebardot;
  long local_3498;
  Scalar local_3468;
  undefined1 local_3460 [352];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  undefined1 local_31c0 [64];
  undefined1 local_3180 [64];
  undefined1 local_3140 [64];
  undefined1 local_3100 [64];
  undefined1 local_30c0 [64];
  undefined1 local_3080 [64];
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  undefined1 local_2fc0 [64];
  undefined1 local_2f80 [64];
  undefined1 local_2f40 [64];
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false> local_2ef8;
  Matrix<double,_96,_3,_0,_96,_3> *local_2ec8;
  undefined1 local_2ec0 [64];
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  undefined1 local_2a40 [64];
  undefined1 local_2a00 [64];
  undefined1 local_29c0 [64];
  undefined1 local_2980 [64];
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined1 local_28c0 [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  undefined1 local_25c0 [64];
  undefined1 local_2580 [64];
  undefined1 local_2540 [64];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [64];
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [64];
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  Matrix<double,_16,_3,_1,_16,_3> local_e00;
  undefined1 local_c80 [128];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  MatrixNx6 local_380;
  
  CalcCombinedCoordMatrix(this,&local_380);
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x28] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2a] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2b] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2c] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2d] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2e] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x2f] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x23] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x24] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x25] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x27] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1c] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x15] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[8]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[9]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [10] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xd] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array
  [0xf] = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[3]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[4]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.m_data.array[7]
       = 0.0;
  if (this->m_numLayers != 0) {
    lVar50 = 0x20;
    local_3498 = 0;
    uVar53 = 0;
    dVar52 = 0.0;
    do {
      auVar55 = local_c80._0_64_;
      if (((long)dVar52 < 0) ||
         ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x10)) {
LAB_00787774:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 16, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 16, BlockCols = 96, InnerPanel = false]"
        ;
LAB_007877a0:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      lVar41 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      dVar1 = (double)((long)dVar52 + 0x60);
      if (lVar41 < (long)dVar1) goto LAB_00787774;
      local_c80._0_8_ =
           (long)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data + local_3498;
      local_c80._16_8_ = &this->m_SD;
      local_c80._24_8_ = 0;
      local_c80._32_8_ = dVar52;
      local_c80._40_8_ = lVar41;
      local_c80._56_8_ = auVar55._56_8_;
      local_c80._48_8_ = &local_380;
      memset((Matrix<double,_96,_6,_0,_96,_6> *)local_2000,0,0x1200);
      local_3460._0_8_ = (_func_int **)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>>,Eigen::Matrix<double,16,6,1,16,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,96,6,0,96,6>>
                ((Matrix<double,_96,_6,_0,_96,_6> *)local_2000,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>
                  *)local_c80,&local_380,(Scalar *)local_3460);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar50) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) {
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_007877a0;
      }
      auVar55 = vmulpd_avx512f(local_1f40,local_1f40);
      local_2040 = local_1f40;
      auVar56 = vmulpd_avx512f(local_1c40,local_1c40);
      local_2080 = local_1c40;
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_1940,local_1940);
      local_20c0 = local_1940;
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar57 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(local_1f40,local_1640);
      auVar59 = vmulpd_avx512f(local_1c40,local_1340);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar59 = vmulpd_avx512f(local_1940,local_1040);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = this->m_Alpha;
      auVar59 = vbroadcastsd_avx512f(auVar4);
      auVar58 = vmulpd_avx512f(auVar58,auVar59);
      local_2800 = vaddpd_avx512f(auVar55,auVar58);
      local_21c0 = local_1f80;
      auVar55 = vmulpd_avx512f(local_1f80,local_1f80);
      auVar58 = vmulpd_avx512f(local_1c80,local_1c80);
      local_2200 = local_1c80;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar58 = vmulpd_avx512f(local_1980,local_1980);
      local_2240 = local_1980;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(local_1f80,local_1680);
      auVar60 = vmulpd_avx512f(local_1c80,local_1380);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1980,local_1080);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar58 = vmulpd_avx512f(auVar58,auVar59);
      local_2840 = vaddpd_avx512f(auVar55,auVar58);
      local_22c0 = local_1fc0;
      auVar55 = vmulpd_avx512f(local_1fc0,local_1fc0);
      auVar58 = vmulpd_avx512f(local_1cc0,local_1cc0);
      local_2300 = local_1cc0;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar58 = vmulpd_avx512f(local_19c0,local_19c0);
      local_2340 = local_19c0;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(local_1fc0,local_16c0);
      auVar60 = vmulpd_avx512f(local_1cc0,local_13c0);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_19c0,local_10c0);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar58 = vmulpd_avx512f(auVar58,auVar59);
      local_2880 = vaddpd_avx512f(auVar55,auVar58);
      local_2380 = local_2000;
      auVar55 = vmulpd_avx512f(local_2000,local_2000);
      auVar58 = vmulpd_avx512f(local_1d00,local_1d00);
      local_23c0 = local_1d00;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar58 = vmulpd_avx512f(local_1a00,local_1a00);
      local_2400 = local_1a00;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(local_2000,local_1700);
      auVar60 = vmulpd_avx512f(local_1d00,local_1400);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1a00,local_1100);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar58 = vmulpd_avx512f(auVar58,auVar59);
      local_28c0 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vmulpd_avx512f(local_1f00,local_1600);
      local_2b00 = local_1f00;
      auVar58 = vmulpd_avx512f(local_1c00,local_1300);
      local_2b80 = local_1c00;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      local_2c80 = local_1000;
      auVar58 = vmulpd_avx512f(local_1900,local_1000);
      local_2ac0 = local_1900;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar58 = vmulpd_avx512f(local_1ec0,local_15c0);
      local_2bc0 = local_12c0;
      auVar60 = vmulpd_avx512f(local_1bc0,local_12c0);
      local_2a80 = local_1bc0;
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      local_2940 = local_fc0;
      auVar60 = vmulpd_avx512f(local_18c0,local_fc0);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1e80,local_1580);
      local_2a40 = local_1e80;
      local_2c00 = local_1280;
      auVar61 = vmulpd_avx512f(local_1b80,local_1280);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      local_2980 = local_f80;
      auVar61 = vmulpd_avx512f(local_1880,local_f80);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      auVar61 = vmulpd_avx512f(local_1e40,local_1540);
      local_2c40 = local_1240;
      auVar62 = vmulpd_avx512f(local_1b40,local_1240);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      local_29c0 = local_f40;
      auVar62 = vmulpd_avx512f(local_1840,local_f40);
      local_2a00 = local_1840;
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_1f00,local_1f00);
      auVar63 = vmulpd_avx512f(local_1c00,local_1c00);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1900,local_1900);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1ec0,local_1ec0);
      auVar64 = vmulpd_avx512f(local_1bc0,local_1bc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_18c0,local_18c0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_1e80,local_1e80);
      auVar65 = vmulpd_avx512f(local_1b80,local_1b80);
      auVar64 = vaddpd_avx512f(auVar64,auVar65);
      auVar65 = vmulpd_avx512f(local_1880,local_1880);
      auVar64 = vaddpd_avx512f(auVar64,auVar65);
      auVar65 = vmulpd_avx512f(local_1e40,local_1e40);
      auVar66 = vmulpd_avx512f(local_1b40,local_1b40);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar66 = vmulpd_avx512f(local_1840,local_1840);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar62 = vaddpd_avx512f(auVar62,auVar56);
      auVar62 = vmulpd_avx512f(auVar62,auVar57);
      auVar55 = vmulpd_avx512f(auVar59,auVar55);
      local_2280 = vaddpd_avx512f(auVar62,auVar55);
      auVar55 = vaddpd_avx512f(auVar63,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(auVar59,auVar58);
      local_2180 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vaddpd_avx512f(auVar64,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(auVar59,auVar60);
      local_2140 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vaddpd_avx512f(auVar65,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(auVar59,auVar61);
      local_2100 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vmulpd_avx512f(local_1e00,local_1500);
      local_26c0 = local_1500;
      auVar58 = vmulpd_avx512f(local_1b00,local_1200);
      local_2780 = local_1200;
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      local_2680 = local_f00;
      auVar58 = vmulpd_avx512f(local_1800,local_f00);
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar58 = vmulpd_avx512f(local_1dc0,local_14c0);
      local_2700 = local_14c0;
      auVar60 = vmulpd_avx512f(local_1ac0,local_11c0);
      local_27c0 = local_11c0;
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_17c0,local_ec0);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1d80,local_1480);
      local_2740 = local_1480;
      local_2600 = local_1180;
      auVar61 = vmulpd_avx512f(local_1a80,local_1180);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      local_2640 = local_e80;
      auVar61 = vmulpd_avx512f(local_1780,local_e80);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      local_2b40 = local_1440;
      auVar61 = vmulpd_avx512f(local_1d40,local_1440);
      auVar62 = vmulpd_avx512f(local_1a40,local_1140);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_1740,local_e40);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_1e00,local_1e00);
      auVar63 = vmulpd_avx512f(local_1b00,local_1b00);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1800,local_1800);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1dc0,local_1dc0);
      auVar64 = vmulpd_avx512f(local_1ac0,local_1ac0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_17c0,local_17c0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_1d80,local_1d80);
      auVar65 = vmulpd_avx512f(local_1a80,local_1a80);
      auVar64 = vaddpd_avx512f(auVar64,auVar65);
      auVar65 = vmulpd_avx512f(local_1780,local_1780);
      auVar64 = vaddpd_avx512f(auVar64,auVar65);
      auVar65 = vmulpd_avx512f(local_1d40,local_1d40);
      auVar66 = vmulpd_avx512f(local_1a40,local_1a40);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar66 = vmulpd_avx512f(local_1740,local_1740);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar62 = vaddpd_avx512f(auVar62,auVar56);
      auVar62 = vmulpd_avx512f(auVar62,auVar57);
      auVar55 = vmulpd_avx512f(auVar59,auVar55);
      local_2500 = vaddpd_avx512f(auVar62,auVar55);
      auVar55 = vaddpd_avx512f(auVar63,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(auVar59,auVar58);
      local_24c0 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vaddpd_avx512f(auVar64,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar58 = vmulpd_avx512f(auVar59,auVar60);
      local_2480 = vaddpd_avx512f(auVar55,auVar58);
      auVar55 = vaddpd_avx512f(auVar65,auVar56);
      auVar55 = vmulpd_avx512f(auVar55,auVar57);
      auVar56 = vmulpd_avx512f(auVar59,auVar61);
      local_2440 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_1e00,local_1600);
      auVar56 = vmulpd_avx512f(local_1b00,local_1300);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_1800,local_1000);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_1f00,local_1500);
      auVar55 = vaddpd_avx512f(auVar56,auVar55);
      auVar56 = vmulpd_avx512f(local_1c00,local_1200);
      auVar55 = vaddpd_avx512f(auVar56,auVar55);
      auVar56 = vmulpd_avx512f(local_1900,local_f00);
      auVar55 = vaddpd_avx512f(auVar56,auVar55);
      auVar56 = vmulpd_avx512f(local_1dc0,local_15c0);
      auVar57 = vmulpd_avx512f(local_1ac0,local_12c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_17c0,local_fc0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_1ec0,local_14c0);
      auVar56 = vaddpd_avx512f(auVar57,auVar56);
      auVar57 = vmulpd_avx512f(local_1bc0,local_11c0);
      auVar56 = vaddpd_avx512f(auVar57,auVar56);
      auVar57 = vmulpd_avx512f(local_18c0,local_ec0);
      auVar56 = vaddpd_avx512f(auVar57,auVar56);
      auVar57 = vmulpd_avx512f(local_1d80,local_1580);
      auVar58 = vmulpd_avx512f(local_1a80,local_1280);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_1780,local_f80);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_1e80,local_1480);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1b80,local_1180);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1880,local_e80);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1d40,local_1540);
      auVar60 = vmulpd_avx512f(local_1a40,local_1240);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1740,local_f40);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1e40,local_1440);
      auVar58 = vaddpd_avx512f(auVar60,auVar58);
      auVar60 = vmulpd_avx512f(local_1b40,local_1140);
      auVar58 = vaddpd_avx512f(auVar60,auVar58);
      auVar60 = vmulpd_avx512f(local_1840,local_e40);
      auVar58 = vaddpd_avx512f(auVar60,auVar58);
      auVar60 = vmulpd_avx512f(local_1f00,local_1e00);
      auVar61 = vmulpd_avx512f(local_1c00,local_1b00);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      auVar61 = vmulpd_avx512f(local_1900,local_1800);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      auVar61 = vmulpd_avx512f(local_1ec0,local_1dc0);
      auVar62 = vmulpd_avx512f(local_1bc0,local_1ac0);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_18c0,local_17c0);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_1e80,local_1d80);
      auVar63 = vmulpd_avx512f(local_1b80,local_1a80);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1880,local_1780);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1e40,local_1d40);
      auVar64 = vmulpd_avx512f(local_1b40,local_1a40);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_1840,local_1740);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar55 = vmulpd_avx512f(auVar59,auVar55);
      local_25c0 = vaddpd_avx512f(auVar60,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar56);
      local_2580 = vaddpd_avx512f(auVar61,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar57);
      local_2540 = vaddpd_avx512f(auVar62,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar58);
      local_2900 = vaddpd_avx512f(auVar63,auVar55);
      auVar55 = vmulpd_avx512f(local_1e00,local_1700);
      auVar56 = vmulpd_avx512f(local_1b00,local_1400);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_1800,local_1100);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2000,local_1500);
      auVar55 = vaddpd_avx512f(auVar56,auVar55);
      auVar56 = vmulpd_avx512f(local_1d00,local_1200);
      auVar55 = vaddpd_avx512f(auVar56,auVar55);
      auVar56 = vmulpd_avx512f(local_1a00,local_f00);
      auVar55 = vaddpd_avx512f(auVar56,auVar55);
      auVar56 = vmulpd_avx512f(local_1dc0,local_16c0);
      auVar57 = vmulpd_avx512f(local_1ac0,local_13c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_17c0,local_10c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_1fc0,local_14c0);
      auVar56 = vaddpd_avx512f(auVar57,auVar56);
      auVar57 = vmulpd_avx512f(local_1cc0,local_11c0);
      auVar56 = vaddpd_avx512f(auVar57,auVar56);
      auVar57 = vmulpd_avx512f(local_19c0,local_ec0);
      auVar56 = vaddpd_avx512f(auVar57,auVar56);
      auVar57 = vmulpd_avx512f(local_1d80,local_1680);
      auVar58 = vmulpd_avx512f(local_1a80,local_1380);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_1780,local_1080);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_1f80,local_1480);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1c80,local_1180);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1980,local_e80);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1d40,local_1640);
      auVar60 = vmulpd_avx512f(local_1a40,local_1340);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1740,local_1040);
      auVar58 = vaddpd_avx512f(auVar58,auVar60);
      auVar60 = vmulpd_avx512f(local_1f40,local_1440);
      auVar58 = vaddpd_avx512f(auVar60,auVar58);
      auVar60 = vmulpd_avx512f(local_1c40,local_1140);
      auVar58 = vaddpd_avx512f(auVar60,auVar58);
      auVar60 = vmulpd_avx512f(local_1940,local_e40);
      auVar58 = vaddpd_avx512f(auVar60,auVar58);
      auVar60 = vmulpd_avx512f(local_2000,local_1e00);
      auVar61 = vmulpd_avx512f(local_1d00,local_1b00);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      auVar61 = vmulpd_avx512f(local_1a00,local_1800);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      auVar61 = vmulpd_avx512f(local_1fc0,local_1dc0);
      auVar62 = vmulpd_avx512f(local_1cc0,local_1ac0);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_19c0,local_17c0);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_1f80,local_1d80);
      auVar63 = vmulpd_avx512f(local_1c80,local_1a80);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1980,local_1780);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1f40,local_1d40);
      auVar64 = vmulpd_avx512f(local_1c40,local_1a40);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_1940,local_1740);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar55 = vmulpd_avx512f(auVar59,auVar55);
      auVar60 = vaddpd_avx512f(auVar60,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar56);
      auVar56 = vaddpd_avx512f(auVar61,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar57);
      local_2d00 = vaddpd_avx512f(auVar62,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar58);
      local_2cc0 = vaddpd_avx512f(auVar63,auVar55);
      auVar55 = vmulpd_avx512f(local_1f00,local_1700);
      auVar57 = vmulpd_avx512f(local_1c00,local_1400);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_1900,local_1100);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_2000,local_1600);
      auVar55 = vaddpd_avx512f(auVar57,auVar55);
      auVar57 = vmulpd_avx512f(local_1d00,local_1300);
      auVar55 = vaddpd_avx512f(auVar57,auVar55);
      auVar57 = vmulpd_avx512f(local_1a00,local_1000);
      auVar55 = vaddpd_avx512f(auVar57,auVar55);
      auVar57 = vmulpd_avx512f(local_1ec0,local_16c0);
      auVar58 = vmulpd_avx512f(local_1bc0,local_13c0);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_18c0,local_10c0);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_1fc0,local_15c0);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1cc0,local_12c0);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_19c0,local_fc0);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_1e80,local_1680);
      auVar61 = vmulpd_avx512f(local_1b80,local_1380);
      auVar58 = vaddpd_avx512f(auVar58,auVar61);
      auVar61 = vmulpd_avx512f(local_1880,local_1080);
      auVar58 = vaddpd_avx512f(auVar58,auVar61);
      auVar61 = vmulpd_avx512f(local_1f80,local_1580);
      auVar58 = vaddpd_avx512f(auVar61,auVar58);
      auVar61 = vmulpd_avx512f(local_1c80,local_1280);
      auVar58 = vaddpd_avx512f(auVar61,auVar58);
      auVar61 = vmulpd_avx512f(local_1980,local_f80);
      auVar58 = vaddpd_avx512f(auVar61,auVar58);
      auVar61 = vmulpd_avx512f(local_1e40,local_1640);
      auVar62 = vmulpd_avx512f(local_1b40,local_1340);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_1840,local_1040);
      auVar61 = vaddpd_avx512f(auVar61,auVar62);
      auVar62 = vmulpd_avx512f(local_1f40,local_1540);
      auVar61 = vaddpd_avx512f(auVar62,auVar61);
      auVar62 = vmulpd_avx512f(local_1c40,local_1240);
      auVar61 = vaddpd_avx512f(auVar62,auVar61);
      auVar62 = vmulpd_avx512f(local_1940,local_f40);
      auVar61 = vaddpd_avx512f(auVar62,auVar61);
      auVar62 = vmulpd_avx512f(local_2000,local_1f00);
      auVar63 = vmulpd_avx512f(local_1d00,local_1c00);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1a00,local_1900);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_1fc0,local_1ec0);
      auVar64 = vmulpd_avx512f(local_1cc0,local_1bc0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_19c0,local_18c0);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_1f80,local_1e80);
      auVar65 = vmulpd_avx512f(local_1c80,local_1b80);
      auVar64 = vaddpd_avx512f(auVar64,auVar65);
      auVar65 = vmulpd_avx512f(local_1980,local_1880);
      auVar64 = vaddpd_avx512f(auVar64,auVar65);
      auVar65 = vmulpd_avx512f(local_1f40,local_1e40);
      auVar66 = vmulpd_avx512f(local_1c40,local_1b40);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar66 = vmulpd_avx512f(local_1940,local_1840);
      auVar65 = vaddpd_avx512f(auVar65,auVar66);
      auVar55 = vmulpd_avx512f(auVar59,auVar55);
      auVar62 = vaddpd_avx512f(auVar62,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar57);
      auVar57 = vaddpd_avx512f(auVar63,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar58);
      auVar58 = vaddpd_avx512f(auVar64,auVar55);
      auVar55 = vmulpd_avx512f(auVar59,auVar61);
      pdVar51 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar59 = vaddpd_avx512f(auVar65,auVar55);
      auVar55 = *(undefined1 (*) [64])(pdVar51 + lVar50 + -0x20);
      local_2ec0 = vmulpd_avx512f(auVar55,local_28c0);
      local_2e80 = vmulpd_avx512f(auVar55,local_2280);
      local_2e40 = vmulpd_avx512f(auVar55,local_2500);
      local_2e00 = vmulpd_avx512f(auVar55,local_25c0);
      local_2dc0 = vmulpd_avx512f(auVar55,auVar60);
      local_2d80 = vmulpd_avx512f(auVar55,auVar62);
      auVar55 = *(undefined1 (*) [64])(pdVar51 + lVar50 + -0x18);
      local_3460._288_64_ = vmulpd_avx512f(auVar55,local_2880);
      local_2d40 = vmulpd_avx512f(auVar55,local_2180);
      local_3300 = vmulpd_avx512f(auVar55,local_24c0);
      local_32c0 = vmulpd_avx512f(auVar55,local_2580);
      local_3280 = vmulpd_avx512f(auVar55,auVar56);
      local_3240 = vmulpd_avx512f(auVar55,auVar57);
      auVar55 = *(undefined1 (*) [64])(pdVar51 + lVar50 + -0x10);
      local_31c0 = vmulpd_avx512f(auVar55,local_2840);
      local_3200 = vmulpd_avx512f(auVar55,local_2140);
      local_3180 = vmulpd_avx512f(auVar55,local_2480);
      local_3140 = vmulpd_avx512f(auVar55,local_2540);
      local_3100 = vmulpd_avx512f(auVar55,local_2d00);
      local_30c0 = vmulpd_avx512f(auVar55,auVar58);
      auVar55 = *(undefined1 (*) [64])(pdVar51 + lVar50 + -8);
      local_3040 = vmulpd_avx512f(auVar55,local_2800);
      local_3080 = vmulpd_avx512f(auVar55,local_2100);
      local_3000 = vmulpd_avx512f(auVar55,local_2440);
      local_2fc0 = vmulpd_avx512f(auVar55,local_2900);
      local_2f80 = vmulpd_avx512f(auVar55,local_2cc0);
      local_2f40 = vmulpd_avx512f(auVar55,auVar59);
      pLVar42 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar41 = *(long *)((long)&pLVar42[-1].m_material.
                                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + lVar50);
      this_00 = *(ChElementShellANCF_3443 **)((long)pLVar42 + lVar50 + -0x18);
      pCVar54 = (ChElementShellANCF_3443 *)local_3460;
      if (this_00 == (ChElementShellANCF_3443 *)0x0) {
        memcpy((ChElementShellANCF_3443 *)local_3460,(void *)(lVar41 + 0x20),0x120);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar2 = &(this_00->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar2 = &(this_00->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy((ChElementShellANCF_3443 *)local_3460,(void *)(lVar41 + 0x20),0x120);
        if (this_00 != (ChElementShellANCF_3443 *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          pCVar54 = this_00;
        }
      }
      RotateReorderStiffnessMatrix
                (pCVar54,(ChMatrixNM<double,_6,_6> *)local_3460,
                 *(double *)
                  ((long)(this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar50 + -8));
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_3460._0_8_;
      auVar55 = vbroadcastsd_avx512f(auVar5);
      auVar56 = vmulpd_avx512f(local_2ec0,auVar55);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_3460._8_8_;
      auVar57 = vbroadcastsd_avx512f(auVar6);
      auVar58 = vmulpd_avx512f(local_2e80,auVar57);
      auVar56 = vaddpd_avx512f(auVar56,auVar58);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_3460._16_8_;
      auVar58 = vbroadcastsd_avx512f(auVar7);
      auVar59 = vmulpd_avx512f(local_2e40,auVar58);
      auVar56 = vaddpd_avx512f(auVar56,auVar59);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_3460._24_8_;
      auVar59 = vbroadcastsd_avx512f(auVar8);
      auVar60 = vmulpd_avx512f(local_2e00,auVar59);
      auVar56 = vaddpd_avx512f(auVar56,auVar60);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_3460._32_8_;
      auVar60 = vbroadcastsd_avx512f(auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_3460._40_8_;
      auVar61 = vbroadcastsd_avx512f(auVar10);
      auVar62 = vmulpd_avx512f(local_2dc0,auVar60);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_2d80,auVar61);
      local_2ac0 = vaddpd_avx512f(auVar56,auVar62);
      auVar56 = vmulpd_avx512f(local_3460._288_64_,auVar55);
      auVar62 = vmulpd_avx512f(local_2d40,auVar57);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3300,auVar58);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_32c0,auVar59);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3280,auVar60);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3240,auVar61);
      local_2b40 = vaddpd_avx512f(auVar56,auVar62);
      auVar56 = vmulpd_avx512f(local_31c0,auVar55);
      auVar62 = vmulpd_avx512f(local_3200,auVar57);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3180,auVar58);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3140,auVar59);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3100,auVar60);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_30c0,auVar61);
      local_2b00 = vaddpd_avx512f(auVar56,auVar62);
      auVar55 = vmulpd_avx512f(local_3040,auVar55);
      auVar56 = vmulpd_avx512f(local_3080,auVar57);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3000,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2fc0,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f80,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f40,auVar61);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_3460._48_8_;
      auVar57 = vbroadcastsd_avx512f(auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_3460._56_8_;
      auVar58 = vbroadcastsd_avx512f(auVar12);
      local_2b80 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2ec0,auVar57);
      auVar56 = vmulpd_avx512f(local_2e80,auVar58);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_3460._64_8_;
      auVar59 = vbroadcastsd_avx512f(auVar13);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2e40,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_3460._72_8_;
      auVar56 = vbroadcastsd_avx512f(auVar14);
      auVar60 = vmulpd_avx512f(local_2e00,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar60);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_3460._80_8_;
      auVar60 = vbroadcastsd_avx512f(auVar15);
      auVar61 = vmulpd_avx512f(local_2dc0,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar61);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_3460._88_8_;
      auVar61 = vbroadcastsd_avx512f(auVar16);
      auVar62 = vmulpd_avx512f(local_2d80,auVar61);
      local_2d00 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_3460._288_64_,auVar57);
      auVar62 = vmulpd_avx512f(local_2d40,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3300,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_32c0,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3280,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3240,auVar61);
      local_2a00 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_31c0,auVar57);
      auVar62 = vmulpd_avx512f(local_3200,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3180,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3140,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3100,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_30c0,auVar61);
      local_2a40 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_3040,auVar57);
      auVar57 = vmulpd_avx512f(local_3080,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_3000,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar56 = vmulpd_avx512f(local_2fc0,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f80,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f40,auVar61);
      local_2a80 = vaddpd_avx512f(auVar55,auVar56);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_3460._96_8_;
      auVar55 = vbroadcastsd_avx512f(auVar17);
      auVar56 = vmulpd_avx512f(local_2ec0,auVar55);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_3460._104_8_;
      auVar57 = vbroadcastsd_avx512f(auVar18);
      auVar58 = vmulpd_avx512f(local_2e80,auVar57);
      auVar56 = vaddpd_avx512f(auVar56,auVar58);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_3460._112_8_;
      auVar58 = vbroadcastsd_avx512f(auVar19);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_3460._120_8_;
      auVar59 = vbroadcastsd_avx512f(auVar20);
      auVar60 = vmulpd_avx512f(local_2e40,auVar58);
      auVar56 = vaddpd_avx512f(auVar56,auVar60);
      auVar60 = vmulpd_avx512f(local_2e00,auVar59);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_3460._128_8_;
      auVar61 = vbroadcastsd_avx512f(auVar21);
      auVar56 = vaddpd_avx512f(auVar56,auVar60);
      auVar60 = vmulpd_avx512f(local_2dc0,auVar61);
      auVar56 = vaddpd_avx512f(auVar56,auVar60);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_3460._136_8_;
      auVar60 = vbroadcastsd_avx512f(auVar22);
      auVar62 = vmulpd_avx512f(local_2d80,auVar60);
      local_2940 = vaddpd_avx512f(auVar56,auVar62);
      auVar56 = vmulpd_avx512f(local_3460._288_64_,auVar55);
      auVar62 = vmulpd_avx512f(local_2d40,auVar57);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3300,auVar58);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_32c0,auVar59);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3280,auVar61);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3240,auVar60);
      local_2980 = vaddpd_avx512f(auVar56,auVar62);
      auVar56 = vmulpd_avx512f(local_31c0,auVar55);
      auVar62 = vmulpd_avx512f(local_3200,auVar57);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3180,auVar58);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3140,auVar59);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3100,auVar61);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_30c0,auVar60);
      local_29c0 = vaddpd_avx512f(auVar56,auVar62);
      auVar55 = vmulpd_avx512f(local_3040,auVar55);
      auVar56 = vmulpd_avx512f(local_3080,auVar57);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3000,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2fc0,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f80,auVar61);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_3460._144_8_;
      auVar56 = vbroadcastsd_avx512f(auVar23);
      auVar57 = vmulpd_avx512f(local_2f40,auVar60);
      local_2cc0 = vaddpd_avx512f(auVar55,auVar57);
      auVar55 = vmulpd_avx512f(local_2ec0,auVar56);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_3460._152_8_;
      auVar57 = vbroadcastsd_avx512f(auVar24);
      auVar58 = vmulpd_avx512f(local_2e80,auVar57);
      auVar55 = vaddpd_avx512f(auVar55,auVar58);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_3460._160_8_;
      auVar58 = vbroadcastsd_avx512f(auVar25);
      auVar59 = vmulpd_avx512f(local_2e40,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar59);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_3460._168_8_;
      auVar59 = vbroadcastsd_avx512f(auVar26);
      auVar60 = vmulpd_avx512f(local_2e00,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar60);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_3460._176_8_;
      auVar60 = vbroadcastsd_avx512f(auVar27);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_3460._184_8_;
      auVar61 = vbroadcastsd_avx512f(auVar28);
      auVar62 = vmulpd_avx512f(local_2dc0,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_2d80,auVar61);
      local_2800 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_3460._288_64_,auVar56);
      auVar62 = vmulpd_avx512f(local_2d40,auVar57);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3300,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_32c0,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3280,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3240,auVar61);
      local_2840 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_31c0,auVar56);
      auVar62 = vmulpd_avx512f(local_3200,auVar57);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3180,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3140,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3100,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_30c0,auVar61);
      local_2880 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_3040,auVar56);
      auVar56 = vmulpd_avx512f(local_3080,auVar57);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3000,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2fc0,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f80,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f40,auVar61);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_3460._192_8_;
      auVar57 = vbroadcastsd_avx512f(auVar29);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_3460._200_8_;
      auVar58 = vbroadcastsd_avx512f(auVar30);
      local_28c0 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2ec0,auVar57);
      auVar56 = vmulpd_avx512f(local_2e80,auVar58);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_3460._208_8_;
      auVar59 = vbroadcastsd_avx512f(auVar31);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2e40,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_3460._216_8_;
      auVar56 = vbroadcastsd_avx512f(auVar32);
      auVar60 = vmulpd_avx512f(local_2e00,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar60);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_3460._224_8_;
      auVar60 = vbroadcastsd_avx512f(auVar33);
      auVar61 = vmulpd_avx512f(local_2dc0,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar61);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_3460._232_8_;
      auVar61 = vbroadcastsd_avx512f(auVar34);
      auVar62 = vmulpd_avx512f(local_2d80,auVar61);
      local_2bc0 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_3460._288_64_,auVar57);
      auVar62 = vmulpd_avx512f(local_2d40,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3300,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_32c0,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3280,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3240,auVar61);
      local_2c00 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_31c0,auVar57);
      auVar62 = vmulpd_avx512f(local_3200,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3180,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3140,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_3100,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar62);
      auVar62 = vmulpd_avx512f(local_30c0,auVar61);
      local_2c40 = vaddpd_avx512f(auVar55,auVar62);
      auVar55 = vmulpd_avx512f(local_3040,auVar57);
      auVar57 = vmulpd_avx512f(local_3080,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_3000,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar56 = vmulpd_avx512f(local_2fc0,auVar56);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f80,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2f40,auVar61);
      local_2c80 = vaddpd_avx512f(auVar55,auVar56);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_3460._240_8_;
      auVar55 = vbroadcastsd_avx512f(auVar35);
      auVar56 = vmulpd_avx512f(local_2ec0,auVar55);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_3460._248_8_;
      auVar57 = vbroadcastsd_avx512f(auVar36);
      auVar58 = vmulpd_avx512f(local_2e80,auVar57);
      auVar56 = vaddpd_avx512f(auVar56,auVar58);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_3460._256_8_;
      auVar58 = vbroadcastsd_avx512f(auVar37);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_3460._264_8_;
      auVar59 = vbroadcastsd_avx512f(auVar38);
      auVar60 = vmulpd_avx512f(local_2e40,auVar58);
      auVar56 = vaddpd_avx512f(auVar56,auVar60);
      auVar60 = vmulpd_avx512f(local_2e00,auVar59);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_3460._272_8_;
      auVar61 = vbroadcastsd_avx512f(auVar39);
      auVar56 = vaddpd_avx512f(auVar56,auVar60);
      auVar60 = vmulpd_avx512f(local_2dc0,auVar61);
      auVar56 = vaddpd_avx512f(auVar56,auVar60);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_3460._280_8_;
      auVar60 = vbroadcastsd_avx512f(auVar40);
      auVar62 = vmulpd_avx512f(local_2d80,auVar60);
      auVar56 = vaddpd_avx512f(auVar56,auVar62);
      auVar62 = vmulpd_avx512f(local_3460._288_64_,auVar55);
      auVar63 = vmulpd_avx512f(local_2d40,auVar57);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_3300,auVar58);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_32c0,auVar59);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_3280,auVar61);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_3240,auVar60);
      auVar62 = vaddpd_avx512f(auVar62,auVar63);
      auVar63 = vmulpd_avx512f(local_31c0,auVar55);
      auVar64 = vmulpd_avx512f(local_3200,auVar57);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_3180,auVar58);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_3140,auVar59);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_3100,auVar61);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar64 = vmulpd_avx512f(local_30c0,auVar60);
      auVar63 = vaddpd_avx512f(auVar63,auVar64);
      auVar55 = vmulpd_avx512f(local_3040,auVar55);
      auVar57 = vmulpd_avx512f(local_3080,auVar57);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_3000,auVar58);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_2fc0,auVar59);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_2f80,auVar61);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_2f40,auVar60);
      auVar55 = vaddpd_avx512f(auVar55,auVar57);
      auVar57 = vmulpd_avx512f(local_2ac0,local_2000);
      auVar58 = vmulpd_avx512f(local_1f00,auVar56);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2bc0,local_1e00);
      local_2ec0 = local_1e00;
      local_c80._0_64_ = vaddpd_avx512f(auVar58,auVar57);
      auVar57 = vmulpd_avx512f(local_2b40,local_1fc0);
      auVar58 = vmulpd_avx512f(auVar62,local_1ec0);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2c00,local_1dc0);
      local_c80._64_64_ = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(local_2b00,local_1f80);
      auVar58 = vmulpd_avx512f(auVar63,local_1e80);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2c40,local_1d80);
      local_c00 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(local_2b80,local_1f40);
      auVar58 = vmulpd_avx512f(auVar55,local_1e40);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2c80,local_1d40);
      local_bc0 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(local_2ac0,local_1d00);
      local_2d40 = local_1c00;
      auVar58 = vmulpd_avx512f(auVar56,local_1c00);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_2d80 = local_1b00;
      auVar58 = vmulpd_avx512f(local_2bc0,local_1b00);
      local_980 = vaddpd_avx512f(auVar57,auVar58);
      local_2dc0 = local_1cc0;
      local_2e00 = local_1bc0;
      auVar57 = vmulpd_avx512f(local_2b40,local_1cc0);
      auVar58 = vmulpd_avx512f(auVar62,local_1bc0);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2c00,local_1ac0);
      local_2e80 = local_1ac0;
      local_940 = vaddpd_avx512f(auVar57,auVar58);
      local_2e40 = local_1c80;
      auVar57 = vmulpd_avx512f(local_2b00,local_1c80);
      local_2f40 = local_1b80;
      auVar58 = vmulpd_avx512f(auVar63,local_1b80);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_2f80 = local_1a80;
      auVar58 = vmulpd_avx512f(local_2c40,local_1a80);
      local_900 = vaddpd_avx512f(auVar57,auVar58);
      local_2fc0 = local_1c40;
      auVar57 = vmulpd_avx512f(local_2b80,local_1c40);
      local_3000 = local_1b40;
      auVar58 = vmulpd_avx512f(auVar55,local_1b40);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_3040 = local_1a40;
      auVar58 = vmulpd_avx512f(local_2c80,local_1a40);
      local_8c0 = vaddpd_avx512f(auVar57,auVar58);
      local_3080 = local_1a00;
      auVar57 = vmulpd_avx512f(local_2ac0,local_1a00);
      local_30c0 = local_1900;
      auVar58 = vmulpd_avx512f(auVar56,local_1900);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_3100 = local_1800;
      auVar58 = vmulpd_avx512f(local_2bc0,local_1800);
      local_680 = vaddpd_avx512f(auVar57,auVar58);
      local_3140 = local_19c0;
      auVar57 = vmulpd_avx512f(local_2b40,local_19c0);
      local_3180 = local_18c0;
      auVar58 = vmulpd_avx512f(auVar62,local_18c0);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_31c0 = local_17c0;
      auVar58 = vmulpd_avx512f(local_2c00,local_17c0);
      local_640 = vaddpd_avx512f(auVar57,auVar58);
      local_3200 = local_1980;
      auVar57 = vmulpd_avx512f(local_2b00,local_1980);
      local_3240 = local_1880;
      auVar58 = vmulpd_avx512f(auVar63,local_1880);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_3280 = local_1780;
      auVar58 = vmulpd_avx512f(local_2c40,local_1780);
      local_600 = vaddpd_avx512f(auVar57,auVar58);
      local_32c0 = local_1940;
      auVar57 = vmulpd_avx512f(local_2b80,local_1940);
      local_3300 = local_1840;
      auVar58 = vmulpd_avx512f(auVar55,local_1840);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_3460._288_64_ = local_1740;
      auVar58 = vmulpd_avx512f(local_2c80,local_1740);
      local_5c0 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(local_2000,auVar56);
      auVar58 = vmulpd_avx512f(local_2d00,local_1f00);
      auVar57 = vaddpd_avx512f(auVar58,auVar57);
      auVar58 = vmulpd_avx512f(local_2800,local_1e00);
      local_b80 = vaddpd_avx512f(auVar58,auVar57);
      auVar57 = vmulpd_avx512f(auVar62,local_1fc0);
      auVar58 = vmulpd_avx512f(local_2a00,local_1ec0);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2840,local_1dc0);
      local_b40 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(auVar63,local_1f80);
      auVar58 = vmulpd_avx512f(local_2a40,local_1e80);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2880,local_1d80);
      local_b00 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(auVar55,local_1f40);
      auVar58 = vmulpd_avx512f(local_2a80,local_1e40);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_28c0,local_1d40);
      local_ac0 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(auVar56,local_1d00);
      auVar58 = vmulpd_avx512f(local_2d00,local_1c00);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2800,local_1b00);
      local_880 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(auVar62,local_1cc0);
      auVar58 = vmulpd_avx512f(local_2a00,local_1bc0);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2840,local_1ac0);
      local_840 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(auVar63,local_1c80);
      auVar58 = vmulpd_avx512f(local_2a40,local_1b80);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_2880,local_1a80);
      local_800 = vaddpd_avx512f(auVar57,auVar58);
      auVar57 = vmulpd_avx512f(auVar55,local_1c40);
      auVar58 = vmulpd_avx512f(local_2a80,local_1b40);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_28c0,local_1a40);
      local_7c0 = vaddpd_avx512f(auVar57,auVar58);
      auVar56 = vmulpd_avx512f(auVar56,local_1a00);
      auVar57 = vmulpd_avx512f(local_2d00,local_1900);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_2800,local_1800);
      local_580 = vaddpd_avx512f(auVar56,auVar57);
      auVar56 = vmulpd_avx512f(auVar62,local_19c0);
      auVar57 = vmulpd_avx512f(local_2a00,local_18c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_2840,local_17c0);
      local_540 = vaddpd_avx512f(auVar56,auVar57);
      auVar56 = vmulpd_avx512f(auVar63,local_1980);
      auVar57 = vmulpd_avx512f(local_2a40,local_1880);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_2880,local_1780);
      local_500 = vaddpd_avx512f(auVar56,auVar57);
      auVar55 = vmulpd_avx512f(auVar55,local_1940);
      auVar56 = vmulpd_avx512f(local_2a80,local_1840);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_28c0,local_1740);
      local_4c0 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2bc0,local_2000);
      auVar56 = vmulpd_avx512f(local_2800,local_1f00);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2940,local_1e00);
      local_a80 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c00,local_1fc0);
      auVar56 = vmulpd_avx512f(local_2840,local_1ec0);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2980,local_1dc0);
      local_a40 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c40,local_1f80);
      auVar56 = vmulpd_avx512f(local_2880,local_1e80);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_29c0,local_1d80);
      local_a00 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c80,local_1f40);
      auVar56 = vmulpd_avx512f(local_28c0,local_1e40);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2cc0,local_1d40);
      local_9c0 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2bc0,local_1d00);
      auVar56 = vmulpd_avx512f(local_2800,local_1c00);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2940,local_1b00);
      local_780 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c00,local_1cc0);
      auVar56 = vmulpd_avx512f(local_2840,local_1bc0);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2980,local_1ac0);
      local_740 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c40,local_1c80);
      auVar56 = vmulpd_avx512f(local_2880,local_1b80);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_29c0,local_1a80);
      local_700 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c80,local_1c40);
      auVar56 = vmulpd_avx512f(local_28c0,local_1b40);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2cc0,local_1a40);
      local_6c0 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2bc0,local_1a00);
      auVar56 = vmulpd_avx512f(local_2800,local_1900);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2940,local_1800);
      local_480 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c00,local_19c0);
      auVar56 = vmulpd_avx512f(local_2840,local_18c0);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2980,local_17c0);
      local_440 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c40,local_1980);
      auVar56 = vmulpd_avx512f(local_2880,local_1880);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_29c0,local_1780);
      local_400 = vaddpd_avx512f(auVar55,auVar56);
      auVar55 = vmulpd_avx512f(local_2c80,local_1940);
      auVar56 = vmulpd_avx512f(local_28c0,local_1840);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_2cc0,local_1740);
      local_3c0 = vaddpd_avx512f(auVar55,auVar56);
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows < 0x10) ||
         (dVar43 = (double)(this->m_SD).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols, (long)dVar43 < (long)dVar1)) goto LAB_00787774;
      local_2ef8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>,_0>.m_data
           = (PointerType)
             ((long)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                    m_storage.m_data + local_3498);
      local_2ef8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_true>.
      m_startRow.m_value = 0;
      local_2ec8 = (Matrix<double,_96,_3,_0,_96,_3> *)local_c80;
      local_3468 = 1.0;
      local_2ef8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_true>.m_xpr =
           &this->m_SD;
      local_2ef8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_true>.
      m_startCol.m_value = (long)dVar52;
      local_2ef8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false,_true>.
      m_outerStride = (Index)dVar43;
      Eigen::internal::
      generic_product_impl<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>,Eigen::Matrix<double,96,3,0,96,3>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,16,3,1,16,3>>
                (&local_e00,&local_2ef8,local_2ec8,&local_3468);
      uVar53 = uVar53 + 1;
      local_3498 = local_3498 + 0x300;
      lVar50 = lVar50 + 0x20;
      dVar52 = dVar1;
    } while (uVar53 < (ulong)(long)this->m_numLayers);
  }
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x30)
  {
    pdVar51 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar51 != (double *)0x0) {
      free((void *)pdVar51[-1]);
    }
    pvVar48 = malloc(0x1c0);
    if (pvVar48 == (void *)0x0) {
      pdVar51 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar48 & 0xffffffffffffffc0) + 0x38) = pvVar48;
      pdVar51 = (double *)(((ulong)pvVar48 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar51 == (double *)0x0) {
      puVar49 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar49 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar49,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar51;
    (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x30;
  }
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x30)
  {
    pdVar51 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar53 = 0xfffffffffffffff8;
    do {
      dVar52 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
               m_data.array[uVar53 + 9];
      dVar1 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
              m_data.array[uVar53 + 10];
      dVar43 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
               m_data.array[uVar53 + 0xb];
      dVar44 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
               m_data.array[uVar53 + 0xc];
      dVar45 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
               m_data.array[uVar53 + 0xd];
      dVar46 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
               m_data.array[uVar53 + 0xe];
      dVar47 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
               m_data.array[uVar53 + 0xf];
      pdVar3 = pdVar51 + uVar53 + 8;
      *pdVar3 = local_e00.super_PlainObjectBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>.m_storage.
                m_data.array[uVar53 + 8];
      pdVar3[1] = dVar52;
      pdVar3[2] = dVar1;
      pdVar3[3] = dVar43;
      pdVar3[4] = dVar44;
      pdVar3[5] = dVar45;
      pdVar3[6] = dVar46;
      pdVar3[7] = dVar47;
      uVar53 = uVar53 + 8;
    } while (uVar53 < 0x28);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 48, 1>>, T1 = double, T2 = double]"
               );
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.  Note that the integrand for the generalize internal force vector for a straight and normalized element
    // is of order : 12 in xi, 12 in eta, and 4 in zeta. This requires GQ 7 points along the xi and eta directions and 3
    // points along the zeta direction for "Full Integration". However, very similar results can be obtained with fewer
    // GQ point in each direction, resulting in significantly fewer calculations.  Based on testing, this could be as
    // low as 4x4x2 or 3x3x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    MatrixNx3 QiCompact;
    QiCompact.setZero();

    // Loop over all of the layers summing the contribution to the generalized internal force vector from each layer
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
        // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
        // The entries are grouped by component in block matrices (column vectors)
        // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
        //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
        //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
        //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> P_Block;

        P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

        P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

        P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

        // =============================================================================
        // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix for the current
        // layer to get the generalized force vector in matrix form (in the correct order if its calculated in row-major
        // memory layout)
        // =============================================================================

        QiCompact.noalias() += m_SD.block<NSF, 3 * NIP>(0, 3 * kl * NIP) * P_Block;
    }

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}